

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::cleanAll(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
           *this)

{
  Lit *pLVar1;
  char *pcVar2;
  int i;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  for (lVar3 = 0; pLVar1 = (this->dirties).data, lVar3 < (this->dirties).sz; lVar3 = lVar3 + 1) {
    pcVar2 = IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::operator[]
                       (&this->dirty,(Lit)*(int *)((long)&pLVar1->x + lVar4));
    if (*pcVar2 != '\0') {
      clean(this,(Lit *)((long)&((this->dirties).data)->x + lVar4));
    }
    lVar4 = lVar4 + 4;
  }
  if (pLVar1 != (Lit *)0x0) {
    (this->dirties).sz = 0;
  }
  return;
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[dirties[i]])
            clean(dirties[i]);
    dirties.clear();
}